

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O3

qint64 __thiscall
QHttpNetworkReplyPrivate::readHeader(QHttpNetworkReplyPrivate *this,QIODevice *socket)

{
  ArrayOptions *pAVar1;
  QHttpNetworkHeaderPrivate *this_00;
  QByteArray *pQVar2;
  QHttpHeaderParser *this_01;
  char cVar3;
  int iVar4;
  Data *pDVar5;
  long lVar6;
  qint64 qVar7;
  bool bVar8;
  char *pcVar9;
  qsizetype qVar10;
  long lVar11;
  qsizetype qVar12;
  char *pcVar13;
  qint64 qVar14;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView name;
  QByteArrayView name_00;
  QByteArrayView name_01;
  QByteArrayView name_02;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView header;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  char c;
  QByteArray local_118;
  QByteArray local_f8;
  QByteArray local_e0;
  QByteArray local_c8;
  QByteArray local_b0;
  QByteArray local_98;
  QByteArray local_78;
  QByteArray local_58;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = &this->fragment;
  if ((this->fragment).d.size == 0) {
    pDVar5 = (pQVar2->d).d;
    if (((pDVar5 == (Data *)0x0) ||
        (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       (lVar6 = (pDVar5->super_QArrayData).alloc,
       (long)((((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar6)
             - (long)(this->fragment).d.ptr) < 0x200)) {
      QByteArray::reallocData((longlong)pQVar2,0x200);
      pDVar5 = (pQVar2->d).d;
      if (pDVar5 == (Data *)0x0) goto LAB_0020a5e3;
      lVar6 = (pDVar5->super_QArrayData).alloc;
    }
    if (lVar6 != 0) {
      pAVar1 = &(pDVar5->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
LAB_0020a5e3:
  local_39 = '\0';
  qVar14 = 0;
  bVar8 = false;
  while( true ) {
    lVar6 = QIODevice::read((char *)socket,(longlong)&local_39);
    if (lVar6 == -1) {
      qVar14 = -1;
      goto LAB_0020a938;
    }
    if (lVar6 == 0) break;
    QByteArray::append((char)pQVar2);
    qVar14 = qVar14 + 1;
    if (local_39 == '\n') {
      pcVar13 = (this->fragment).d.ptr;
      lVar11 = (this->fragment).d.size;
      QVar15.m_data = "\n\r\n";
      QVar15.m_size = 3;
      QVar18.m_data = pcVar13;
      QVar18.m_size = lVar11;
      cVar3 = QtPrivate::endsWith(QVar18,QVar15);
      if ((cVar3 != '\0') ||
         (QVar16.m_data = "\n\n", QVar16.m_size = 2, QVar19.m_data = pcVar13, QVar19.m_size = lVar11
         , cVar3 = QtPrivate::endsWith(QVar19,QVar16), cVar3 != '\0')) {
        bVar8 = true;
      }
      if (lVar11 == 1) {
        qVar12 = 1;
        qVar10 = 1;
        pcVar9 = "\n";
      }
      else {
        if (lVar11 != 2) goto LAB_0020a6d0;
        qVar12 = 2;
        qVar10 = 2;
        pcVar9 = "\r\n";
      }
      QVar17.m_data = pcVar9;
      QVar17.m_size = qVar10;
      QVar20.m_data = pcVar13;
      QVar20.m_size = qVar12;
      cVar3 = QtPrivate::endsWith(QVar20,QVar17);
      if (cVar3 != '\0') goto LAB_0020a709;
    }
LAB_0020a6d0:
    if ((lVar6 < 1) || (bVar8)) break;
  }
  if (!bVar8) goto LAB_0020a938;
  pcVar13 = (this->fragment).d.ptr;
  lVar11 = (this->fragment).d.size;
LAB_0020a709:
  this_01 = &(this->super_QHttpNetworkHeaderPrivate).parser;
  header.m_data = pcVar13;
  header.m_size = lVar11;
  QHttpHeaderParser::parseHeaders(this_01,header);
  this->state = ReadingDataState;
  QByteArray::clear();
  this_00 = &this->super_QHttpNetworkHeaderPrivate;
  qVar7 = QHttpNetworkHeaderPrivate::contentLength(this_00);
  this->bodyLength = qVar7;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (storage_type *)0x0;
  local_98.d.size = 0;
  name.m_data = "transfer-encoding";
  name.m_size = 0x11;
  QHttpNetworkHeaderPrivate::headerField(&local_78,this_00,name,&local_98);
  QByteArray::toLower_helper(&local_58);
  QVar21.m_data = local_58.d.ptr;
  QVar21.m_size = local_58.d.size;
  QVar25.m_data = "chunked";
  QVar25.m_size = 7;
  lVar6 = QtPrivate::findByteArray(QVar21,0,QVar25);
  this->chunkedTransferEncoding = lVar6 != -1;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
    }
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (storage_type *)0x0;
  local_78.d.size = 0;
  name_00.m_data = "connection";
  name_00.m_size = 10;
  QHttpNetworkHeaderPrivate::headerField(&local_58,this_00,name_00,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  QByteArray::toLower_helper(&local_78);
  QVar22.m_data = local_78.d.ptr;
  QVar22.m_size = local_78.d.size;
  QVar26.m_data = "close";
  QVar26.m_size = 5;
  lVar6 = QtPrivate::findByteArray(QVar22,0,QVar26);
  if (lVar6 == -1) {
    local_c8.d.d = (Data *)0x0;
    local_c8.d.ptr = (char *)0x0;
    local_c8.d.size = 0;
    name_01.m_data = "proxy-connection";
    name_01.m_size = 0x10;
    QHttpNetworkHeaderPrivate::headerField(&local_b0,this_00,name_01,&local_c8);
    QByteArray::toLower_helper(&local_98);
    QVar23.m_data = local_98.d.ptr;
    QVar23.m_size = local_98.d.size;
    QVar27.m_data = "close";
    QVar27.m_size = 5;
    lVar6 = QtPrivate::findByteArray(QVar23,0,QVar27);
    bVar8 = true;
    if (lVar6 == -1) {
      iVar4 = QHttpHeaderParser::getMajorVersion(this_01);
      if (((iVar4 != 1) || (iVar4 = QHttpHeaderParser::getMinorVersion(this_01), iVar4 != 0)) ||
         ((undefined1 *)local_58.d.size != (undefined1 *)0x0)) {
        bVar8 = false;
        goto LAB_0020a9f4;
      }
      local_118.d.d = (Data *)0x0;
      local_118.d.ptr = (char *)0x0;
      local_118.d.size = 0;
      name_02.m_data = "proxy-connection";
      name_02.m_size = 0x10;
      QHttpNetworkHeaderPrivate::headerField(&local_f8,this_00,name_02,&local_118);
      QByteArray::toLower_helper(&local_e0);
      QVar24.m_data = local_e0.d.ptr;
      QVar24.m_size = local_e0.d.size;
      QVar28.m_data = "keep-alive";
      QVar28.m_size = 10;
      lVar6 = QtPrivate::findByteArray(QVar24,0,QVar28);
      this->connectionCloseEnabled = lVar6 == -1;
      if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
    else {
LAB_0020a9f4:
      this->connectionCloseEnabled = bVar8;
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    this->connectionCloseEnabled = true;
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_0020a938:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar14;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readHeader(QIODevice *socket)
{
    if (fragment.isEmpty()) {
        // according to http://dev.opera.com/articles/view/mama-http-headers/ the average size of the header
        // block is 381 bytes.
        // reserve bytes. This is better than always append() which reallocs the byte array.
        fragment.reserve(512);
    }

    qint64 bytes = 0;
    char c = 0;
    bool allHeaders = false;
    qint64 haveRead = 0;
    do {
        haveRead = socket->read(&c, 1);
        if (haveRead == 0) {
            // read more later
            break;
        } else if (haveRead == -1) {
            // connection broke down
            return -1;
        } else {
            fragment.append(c);
            bytes++;

            if (c == '\n') {
                // check for possible header endings. As per HTTP rfc,
                // the header endings will be marked by CRLFCRLF. But
                // we will allow CRLFCRLF, CRLFLF, LFCRLF, LFLF
                if (fragment.endsWith("\n\r\n")
                    || fragment.endsWith("\n\n"))
                    allHeaders = true;

                // there is another case: We have no headers. Then the fragment equals just the line ending
                if ((fragment.size() == 2 && fragment.endsWith("\r\n"))
                    || (fragment.size() == 1 && fragment.endsWith("\n")))
                    allHeaders = true;
            }
        }
    } while (!allHeaders && haveRead > 0);

    // we received all headers now parse them
    if (allHeaders) {
        parseHeader(fragment);
        state = ReadingDataState;
        fragment.clear(); // next fragment
        bodyLength = contentLength(); // cache the length

        // cache isChunked() since it is called often
        chunkedTransferEncoding = headerField("transfer-encoding").toLower().contains("chunked");

        // cache isConnectionCloseEnabled since it is called often
        QByteArray connectionHeaderField = headerField("connection");
        // check for explicit indication of close or the implicit connection close of HTTP/1.0
        connectionCloseEnabled = (connectionHeaderField.toLower().contains("close") ||
            headerField("proxy-connection").toLower().contains("close")) ||
            (parser.getMajorVersion() == 1 && parser.getMinorVersion() == 0 &&
            (connectionHeaderField.isEmpty() && !headerField("proxy-connection").toLower().contains("keep-alive")));
    }
    return bytes;
}